

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O3

int lws_tls_server_conn_alpn(lws *wsi)

{
  uint *puVar1;
  lws_tls_conn *plVar2;
  int iVar3;
  ulong __n;
  uint len;
  uchar *name;
  char cstr [10];
  uint local_3c;
  void *local_38;
  char local_2a [10];
  
  local_38 = (void *)0x0;
  iVar3 = 0;
  _lws_log(8,"%s\n","lws_tls_server_conn_alpn");
  plVar2 = (wsi->tls).ssl;
  if (plVar2 == (lws_tls_conn *)0x0) {
    _lws_log(1,"%s: non-ssl\n","lws_tls_server_conn_alpn");
  }
  else {
    SSL_get0_alpn_selected(plVar2,&local_38,&local_3c);
    if (local_3c == 0) {
      iVar3 = 0;
      _lws_log(8,"no ALPN upgrade\n");
    }
    else {
      if (9 < local_3c) {
        local_3c = 9;
      }
      __n = (ulong)local_3c;
      memcpy(local_2a,local_38,__n);
      local_2a[__n] = '\0';
      _lws_log(8,"%s: negotiated \'%s\' using ALPN\n","lws_tls_server_conn_alpn",local_2a);
      puVar1 = &(wsi->tls).use_ssl;
      *(byte *)puVar1 = (byte)*puVar1 | 1;
      iVar3 = lws_role_call_alpn_negotiated(wsi,local_2a);
    }
  }
  return iVar3;
}

Assistant:

int
lws_tls_server_conn_alpn(struct lws *wsi)
{
#if defined(LWS_WITH_MBEDTLS) || (defined(OPENSSL_VERSION_NUMBER) && \
				  OPENSSL_VERSION_NUMBER >= 0x10002000L)
	const unsigned char *name = NULL;
	char cstr[10];
	unsigned len;

	lwsl_info("%s\n", __func__);

	if (!wsi->tls.ssl) {
		lwsl_err("%s: non-ssl\n", __func__);
		return 0;
	}

	SSL_get0_alpn_selected(wsi->tls.ssl, &name, &len);
	if (!len) {
		lwsl_info("no ALPN upgrade\n");
		return 0;
	}

	if (len > sizeof(cstr) - 1)
		len = sizeof(cstr) - 1;

	memcpy(cstr, name, len);
	cstr[len] = '\0';

	lwsl_info("%s: negotiated '%s' using ALPN\n", __func__, cstr);
	wsi->tls.use_ssl |= LCCSCF_USE_SSL;

	return lws_role_call_alpn_negotiated(wsi, (const char *)cstr);
#else
	lwsl_err("%s: openssl too old\n", __func__);
#endif // OPENSSL_VERSION_NUMBER >= 0x10002000L

	return 0;
}